

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall
CDBWrapper::Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
          (CDBWrapper *this,DBHeightKey *key,
          pair<uint256,_(anonymous_namespace)::DBVal>_conflict *value)

{
  Span<const_std::byte> sp;
  long in_FS_OFFSET;
  bool bVar1;
  Span<const_std::byte> key_00;
  DataStream ssValue;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strValue;
  DataStream DStack_88;
  DataStream local_68;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_48;
  bool local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_read_pos = 0;
  local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve(&local_68.vch,0x40);
  DataStream::operator<<(&local_68,key);
  key_00.m_data =
       local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start + local_68.m_read_pos;
  key_00.m_size =
       (long)local_68.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
  ReadImpl_abi_cxx11_((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_48,this,key_00);
  bVar1 = local_28 != false;
  if (bVar1) {
    sp.m_size = local_48._M_value._M_string_length;
    sp.m_data = (byte *)local_48._M_value._M_dataplus._M_p;
    DataStream::DataStream(&DStack_88,sp);
    DataStream::Xor(&DStack_88,&this->obfuscate_key);
    DataStream::read(&DStack_88,(int)value,(void *)0x20,key_00.m_size);
    Unserialize<DataStream,_(anonymous_namespace)::DBVal_&>(&DStack_88,&value->second);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_88);
  }
  if ((local_28 == true) &&
     (local_28 = false,
     local_48._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_48._M_value + 0x10))) {
    operator_delete((void *)local_48._M_value._M_dataplus._M_p,local_48._16_8_ + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool Read(const K& key, V& value) const
    {
        DataStream ssKey{};
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        std::optional<std::string> strValue{ReadImpl(ssKey)};
        if (!strValue) {
            return false;
        }
        try {
            DataStream ssValue{MakeByteSpan(*strValue)};
            ssValue.Xor(obfuscate_key);
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }